

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
          (SmallVectorBase<slang::ConstantValue> *this,ConstantValue *args)

{
  iterator pCVar1;
  ConstantValue *args_local;
  SmallVectorBase<slang::ConstantValue> *this_local;
  
  if (this->len == this->cap) {
    pCVar1 = end(this);
    this_local = (SmallVectorBase<slang::ConstantValue> *)
                 emplaceRealloc<slang::ConstantValue>(this,pCVar1,args);
  }
  else {
    pCVar1 = end(this);
    slang::ConstantValue::ConstantValue(pCVar1,args);
    this->len = this->len + 1;
    this_local = (SmallVectorBase<slang::ConstantValue> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }